

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  rar_filter *filter;
  void *pvVar4;
  ulong uVar5;
  byte *pbVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  uchar *puVar16;
  uLong uVar17;
  uint uVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  void *__src;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int local_a4;
  long local_68;
  size_t local_38;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x4f50) == -1) {
    *(undefined4 *)((long)pvVar1 + 0x4f50) = 0;
  }
  if (0 < *(long *)((long)pvVar1 + 0xa0)) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0xa0));
    *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  }
  *buff = (void *)0x0;
  if ((*(char *)((long)pvVar1 + 0xed) == '\0') &&
     (*(long *)((long)pvVar1 + 200) < *(long *)((long)pvVar1 + 0x28))) {
    if (*(byte *)((long)pvVar1 + 0x17) - 0x31 < 5) {
      local_68 = 0;
LAB_0014e44e:
      pvVar2 = a->format->data;
      if (*(char *)((long)pvVar2 + 0xd0) != '\0') {
        local_a4 = -0x1e;
        local_68 = local_68 + 1;
        p = (CPpmd7 *)((long)pvVar2 + 0x3d8);
        rc = (IPpmd7_RangeDec *)((long)pvVar2 + 0x4ec8);
        uVar15 = 0;
        do {
          sVar3 = *(size_t *)((long)pvVar2 + 0x3c8);
          if (sVar3 != 0) {
            uVar9 = *(uint *)((long)pvVar2 + 0xd4);
            if ((ulong)uVar9 == 0) {
              pvVar14 = *(void **)((long)pvVar2 + 0x3c0);
              *buff = pvVar14;
              *size = sVar3;
              *(long *)((long)pvVar2 + 0xb8) = *(long *)((long)pvVar2 + 0xb8) + sVar3;
              lVar19 = *(long *)((long)pvVar2 + 0xc0);
              *offset = lVar19;
              *(size_t *)((long)pvVar2 + 0xc0) = lVar19 + *size;
              *(long *)((long)pvVar2 + 0x3c8) = *(long *)((long)pvVar2 + 0x3c8) - *size;
              *(size_t *)((long)pvVar2 + 0x3c0) = (long)pvVar14 + *size;
              puVar16 = (uchar *)*buff;
            }
            else {
              puVar16 = *(uchar **)((long)pvVar2 + 0xe0);
              *buff = puVar16;
              *size = (ulong)uVar9;
              *(undefined4 *)((long)pvVar2 + 0xd4) = 0;
LAB_0014ed25:
              lVar19 = *(long *)((long)pvVar2 + 0xc0);
              *offset = lVar19;
              *(size_t *)((long)pvVar2 + 0xc0) = lVar19 + *size;
            }
            uVar17 = cm_zlib_z_crc32(*(unsigned_long *)((long)pvVar2 + 0xf0),puVar16,(uInt)*size);
            *(uLong *)((long)pvVar2 + 0xf0) = uVar17;
LAB_0014ee04:
            local_a4 = (int)uVar15;
            if (local_a4 == -0x14) {
              return -0x14;
            }
            if (local_a4 == 0) {
              return 0;
            }
            goto LAB_0014eebb;
          }
          if (*(char *)((long)pvVar2 + 0x3d1) != '\0') {
LAB_0014ec28:
            uVar9 = *(uint *)((long)pvVar2 + 0xd4);
            if ((ulong)uVar9 != 0) {
              puVar16 = *(uchar **)((long)pvVar2 + 0xe0);
              *buff = puVar16;
              *size = (ulong)uVar9;
              lVar19 = *(long *)((long)pvVar2 + 0xc0);
              *offset = lVar19;
              *(size_t *)((long)pvVar2 + 0xc0) = lVar19 + *size;
              uVar17 = cm_zlib_z_crc32(*(unsigned_long *)((long)pvVar2 + 0xf0),puVar16,(uInt)*size);
              *(uLong *)((long)pvVar2 + 0xf0) = uVar17;
              *(undefined4 *)((long)pvVar2 + 0xd4) = 0;
              return 0;
            }
            *buff = (void *)0x0;
            *size = 0;
            *offset = *(int64_t *)((long)pvVar2 + 0xb8);
            if (*(long *)((long)pvVar2 + 8) == *(long *)((long)pvVar2 + 0xf0)) {
              *(undefined1 *)((long)pvVar2 + 0xed) = 1;
              local_a4 = 1;
            }
            else {
              pcVar20 = "File CRC error";
LAB_0014eeac:
              archive_set_error(&a->archive,0x54,pcVar20);
            }
            goto LAB_0014eebb;
          }
          if (*(int *)((long)pvVar2 + 0xe8) == 0) {
LAB_0014e4f7:
            if (*(long *)((long)pvVar2 + 0x3b8) != *(long *)((long)pvVar2 + 0x3a8)) {
              if ((*(long *)((long)pvVar2 + 0x4f48) == 0) &&
                 (uVar15 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
                pvVar14 = rar_read_ahead(a,1,(ssize_t *)((long)pvVar2 + 0x4f40));
                *(void **)((long)pvVar2 + 0x4f48) = pvVar14;
                if (pvVar14 == (void *)0x0) {
                  pcVar20 = "Truncated RAR file data";
                  goto LAB_0014eeac;
                }
                if (*(int *)((long)pvVar2 + 0x4f38) == 0) {
                  rar_br_fillup(a,(rar_br *)((long)pvVar2 + 0x4f30));
                }
                uVar15 = 0;
              }
              if (*(char *)((long)pvVar2 + 0x388) != '\0') {
                uVar9 = parse_codes(a);
                uVar15 = (ulong)uVar9;
                if (-0x15 < (int)uVar9) goto LAB_0014e663;
                goto LAB_0014ee04;
              }
LAB_0014e663:
              if (*(char *)((long)pvVar2 + 0x3d2) == '\0') {
                lVar19 = *(long *)((long)pvVar2 + 0xb8);
                lVar22 = (ulong)*(uint *)((long)pvVar2 + 0xe8) + lVar19;
                if (*(long *)((long)pvVar2 + 0x3a8) < lVar22) {
                  lVar22 = *(long *)((long)pvVar2 + 0x3a8);
                }
                uVar15 = expand(a,lVar22);
                if ((long)uVar15 < 0) goto LAB_0014ee04;
                uVar12 = uVar15 - lVar19;
                *(ulong *)((long)pvVar2 + 0xb0) = uVar12;
                *(ulong *)((long)pvVar2 + 0x3b8) = uVar15;
                if ((uVar12 == 0) && (uVar15 != *(ulong *)((long)pvVar2 + 0x3a8))) {
                  pcVar20 = "Internal error extracting RAR file";
                  goto LAB_0014eeac;
                }
              }
              else {
                iVar11 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar11 < 0) {
LAB_0014ecb4:
                  pcVar20 = "Invalid symbol";
                  goto LAB_0014eeac;
                }
                if (iVar11 == *(int *)((long)pvVar2 + 0x3d4)) {
                  iVar10 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar10 < 0) goto LAB_0014ecb4;
                  switch(iVar10) {
                  case 0:
                    goto switchD_0014e6cb_caseD_0;
                  default:
                    goto LAB_0014ea84;
                  case 2:
                    *(undefined1 *)((long)pvVar2 + 0x3d1) = 1;
                    goto LAB_0014eb08;
                  case 3:
                    archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                    local_a4 = -0x19;
                    goto LAB_0014eebb;
                  case 4:
                    uVar9 = 0;
                    iVar11 = 0x10;
                    do {
                      iVar10 = Ppmd7_DecodeSymbol(p,rc);
                      if (iVar10 < 0) goto LAB_0014ecb4;
                      uVar9 = uVar9 | iVar10 << ((byte)iVar11 & 0x1f);
                      iVar11 = iVar11 + -8;
                    } while (iVar11 != -8);
                    iVar11 = Ppmd7_DecodeSymbol(p,rc);
                    if (iVar11 < 0) goto LAB_0014ecb4;
                    uVar21 = iVar11 + 0x20;
                    uVar8 = *(uint *)((long)pvVar2 + 0x358);
                    uVar23 = *(uint *)((long)pvVar2 + 0x360) & uVar8;
                    uVar25 = (uVar23 - uVar9) - 2 & uVar8;
                    uVar9 = uVar21;
                    do {
                      uVar18 = uVar25;
                      if ((int)uVar25 < (int)uVar23) {
                        uVar18 = uVar23;
                      }
                      uVar18 = (uVar8 - uVar18) + 1;
                      if ((int)uVar9 < (int)uVar18) {
                        uVar18 = uVar9;
                      }
                      pvVar13 = (void *)((long)(int)uVar23 + *(long *)((long)pvVar2 + 0x350));
                      pvVar14 = (void *)(*(long *)((long)pvVar2 + 0x350) + (long)(int)uVar25);
                      if (((int)(uVar18 + uVar23) < (int)uVar25) ||
                         ((int)(uVar18 + uVar25) < (int)uVar23)) {
                        memcpy(pvVar13,pvVar14,(long)(int)uVar18);
                      }
                      else if (0 < (int)uVar18) {
                        uVar15 = 0;
                        do {
                          *(undefined1 *)((long)pvVar13 + uVar15) =
                               *(undefined1 *)((long)pvVar14 + uVar15);
                          uVar15 = uVar15 + 1;
                        } while (uVar18 != uVar15);
                      }
                      uVar8 = *(uint *)((long)pvVar2 + 0x358);
                      uVar23 = uVar18 + uVar23 & uVar8;
                      uVar25 = uVar18 + uVar25 & uVar8;
                      uVar24 = uVar9 - uVar18;
                      bVar7 = (int)uVar18 <= (int)uVar9;
                      uVar9 = uVar24;
                    } while (uVar24 != 0 && bVar7);
                    break;
                  case 5:
                    iVar11 = Ppmd7_DecodeSymbol(p,rc);
                    if (iVar11 < 0) goto LAB_0014ecb4;
                    uVar21 = iVar11 + 4;
                    uVar9 = *(uint *)((long)pvVar2 + 0x358);
                    uVar23 = *(uint *)((long)pvVar2 + 0x360) & uVar9;
                    uVar25 = uVar23 - 1 & uVar9;
                    uVar8 = uVar21;
                    do {
                      uVar18 = uVar25;
                      if ((int)uVar25 < (int)uVar23) {
                        uVar18 = uVar23;
                      }
                      uVar18 = (uVar9 - uVar18) + 1;
                      if ((int)uVar8 < (int)uVar18) {
                        uVar18 = uVar8;
                      }
                      pvVar13 = (void *)((long)(int)uVar23 + *(long *)((long)pvVar2 + 0x350));
                      pvVar14 = (void *)(*(long *)((long)pvVar2 + 0x350) + (long)(int)uVar25);
                      if (((int)(uVar18 + uVar23) < (int)uVar25) ||
                         ((int)(uVar18 + uVar25) < (int)uVar23)) {
                        memcpy(pvVar13,pvVar14,(long)(int)uVar18);
                      }
                      else if (0 < (int)uVar18) {
                        uVar15 = 0;
                        do {
                          *(undefined1 *)((long)pvVar13 + uVar15) =
                               *(undefined1 *)((long)pvVar14 + uVar15);
                          uVar15 = uVar15 + 1;
                        } while (uVar18 != uVar15);
                      }
                      uVar9 = *(uint *)((long)pvVar2 + 0x358);
                      uVar23 = uVar18 + uVar23 & uVar9;
                      uVar25 = uVar18 + uVar25 & uVar9;
                      uVar24 = uVar8 - uVar18;
                      bVar7 = (int)uVar18 <= (int)uVar8;
                      uVar8 = uVar24;
                    } while (uVar24 != 0 && bVar7);
                  }
                  uVar12 = (ulong)uVar21;
                  lVar19 = *(long *)((long)pvVar2 + 0x360) + uVar12;
                }
                else {
LAB_0014ea84:
                  *(char *)(*(long *)((long)pvVar2 + 0x350) +
                           (long)(int)(*(uint *)((long)pvVar2 + 0x358) &
                                      *(uint *)((long)pvVar2 + 0x360))) = (char)iVar11;
                  lVar19 = *(long *)((long)pvVar2 + 0x360) + 1;
                  uVar12 = 1;
                }
                *(long *)((long)pvVar2 + 0x360) = lVar19;
                uVar12 = uVar12 + *(long *)((long)pvVar2 + 0xb0);
                *(ulong *)((long)pvVar2 + 0xb0) = uVar12;
              }
              uVar15 = (ulong)(uint)(*(int *)((long)pvVar2 + 0xd8) - *(int *)((long)pvVar2 + 0xd4));
              if ((long)uVar12 < (long)uVar15) {
                uVar15 = uVar12;
              }
              uVar9 = copy_from_lzss_window_to_unp
                                (a,buff,*(int64_t *)((long)pvVar2 + 0xb8),(int)uVar15);
              if (uVar9 != 0) goto LAB_0014ed83;
              *(long *)((long)pvVar2 + 0xb8) = *(long *)((long)pvVar2 + 0xb8) + uVar15;
              *(long *)((long)pvVar2 + 0xb0) = *(long *)((long)pvVar2 + 0xb0) - uVar15;
              uVar15 = 0;
              goto LAB_0014eb08;
            }
            pvVar14 = a->format->data;
            filter = *(rar_filter **)((long)pvVar14 + 0x3a0);
            lVar19 = *(long *)((long)pvVar14 + 0x3a8);
            uVar9 = filter->blocklength;
            *(undefined8 *)((long)pvVar14 + 0x3a8) = 0x7fffffffffffffff;
            uVar12 = expand(a,(ulong)uVar9 + lVar19);
            uVar9 = filter->blocklength;
            if (uVar12 != lVar19 + (ulong)uVar9) goto LAB_0014eebb;
            pvVar13 = *(void **)((long)pvVar14 + 0x390);
            if (pvVar13 == (void *)0x0) {
              pvVar13 = calloc(1,0x40024);
              *(void **)((long)pvVar14 + 0x390) = pvVar13;
              if (pvVar13 == (void *)0x0) goto LAB_0014eebb;
            }
            pvVar4 = a->format->data;
            uVar23 = (uint)lVar19 & *(uint *)((long)pvVar4 + 0x358);
            uVar8 = (*(uint *)((long)pvVar4 + 0x358) - uVar23) + 1;
            if ((int)uVar8 < 0) {
              archive_set_error(&a->archive,0x54,"Bad RAR file data");
              goto LAB_0014eebb;
            }
            __src = (void *)((long)(int)uVar23 + *(long *)((long)pvVar4 + 0x350));
            if (uVar9 - uVar8 != 0 && (int)uVar8 <= (int)uVar9) {
              memcpy((void *)((long)pvVar13 + 0x20),__src,(ulong)uVar8);
              __src = *(void **)((long)pvVar4 + 0x350);
              uVar9 = uVar9 - uVar8;
            }
            memcpy((void *)((long)pvVar13 + 0x20),__src,(long)(int)uVar9);
            iVar11 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar14 + 0x390),
                                    *(size_t *)((long)pvVar14 + 0xb8));
            while( true ) {
              if (iVar11 == 0) goto LAB_0014eebb;
              uVar9 = filter->filteredblockaddress;
              uVar8 = filter->filteredblocklength;
              *(rar_filter **)((long)pvVar14 + 0x3a0) = filter->next;
              filter->next = (rar_filter *)0x0;
              delete_filter(filter);
              filter = *(rar_filter **)((long)pvVar14 + 0x3a0);
              if (filter == (rar_filter *)0x0) goto LAB_0014e883;
              uVar5 = filter->blockstartpos;
              if ((uVar5 != *(ulong *)((long)pvVar14 + 0x3a8)) || (filter->blocklength != uVar8))
              break;
              memmove((void *)(*(long *)((long)pvVar14 + 0x390) + 0x20),
                      (void *)(*(long *)((long)pvVar14 + 0x390) + (ulong)uVar9 + 0x20),(ulong)uVar8)
              ;
              iVar11 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar14 + 0x390),
                                      *(size_t *)((long)pvVar14 + 0xb8));
            }
            if (uVar5 < uVar12) goto LAB_0014eebb;
            *(ulong *)((long)pvVar14 + 0x3a8) = uVar5;
LAB_0014e883:
            *(ulong *)((long)pvVar14 + 0x3b8) = uVar12;
            *(ulong *)((long)pvVar14 + 0x3c0) =
                 *(long *)((long)pvVar14 + 0x390) + (ulong)uVar9 + 0x20;
            *(ulong *)((long)pvVar14 + 0x3c8) = (ulong)uVar8;
LAB_0014eb08:
            puVar16 = (uchar *)*buff;
            if (puVar16 != (uchar *)0x0) {
              *(undefined4 *)((long)pvVar2 + 0xd4) = 0;
              *size = (ulong)*(uint *)((long)pvVar2 + 0xd8);
              goto LAB_0014ed25;
            }
          }
          else {
            if (*(long *)((long)pvVar2 + 0x28) <= *(long *)((long)pvVar2 + 0xb8)) goto LAB_0014ec28;
            if ((*(char *)((long)pvVar2 + 0x3d2) != '\0') ||
               (uVar12 = *(ulong *)((long)pvVar2 + 0xb0), (long)uVar12 < 1)) goto LAB_0014e4f7;
            uVar15 = (ulong)(uint)(*(int *)((long)pvVar2 + 0xd8) - *(int *)((long)pvVar2 + 0xd4));
            if (uVar12 < uVar15) {
              uVar15 = uVar12;
            }
            uVar9 = copy_from_lzss_window_to_unp(a,buff,*(long *)((long)pvVar2 + 0xb8),(int)uVar15);
            if (uVar9 != 0) {
LAB_0014ed83:
              uVar15 = (ulong)uVar9;
              goto LAB_0014ee04;
            }
            *(long *)((long)pvVar2 + 0xb8) = *(long *)((long)pvVar2 + 0xb8) + uVar15;
            *(long *)((long)pvVar2 + 0xb0) = *(long *)((long)pvVar2 + 0xb0) - uVar15;
            puVar16 = (uchar *)*buff;
            uVar15 = 0;
            if (puVar16 != (uchar *)0x0) {
              *(undefined4 *)((long)pvVar2 + 0xd4) = 0;
              *size = (ulong)*(uint *)((long)pvVar2 + 0xd8);
              lVar19 = *(long *)((long)pvVar2 + 0xc0);
              *offset = lVar19;
              *(size_t *)((long)pvVar2 + 0xc0) = lVar19 + *size;
              uVar17 = cm_zlib_z_crc32(*(unsigned_long *)((long)pvVar2 + 0xf0),puVar16,(uInt)*size);
              *(uLong *)((long)pvVar2 + 0xf0) = uVar17;
              return 0;
            }
          }
          if (*(char *)((long)pvVar2 + 0xd0) == '\0') goto LAB_0014eebb;
        } while( true );
      }
      local_a4 = -0x1e;
      goto LAB_0014eebb;
    }
    if (*(byte *)((long)pvVar1 + 0x17) == 0x30) {
      pbVar6 = (byte *)a->format->data;
      if ((*(long *)(pbVar6 + 0xa8) == 0) && (((*pbVar6 & 1) == 0 || ((pbVar6[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar6 + 0xb8);
        if (*(long *)(pbVar6 + 8) == *(long *)(pbVar6 + 0xf0)) {
          pbVar6[0xed] = 1;
          goto LAB_0014eb71;
        }
        pcVar20 = "File CRC error";
      }
      else {
        puVar16 = (uchar *)rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = puVar16;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar19 = *(long *)(pbVar6 + 0xb8);
          *offset = lVar19;
          *(size_t *)(pbVar6 + 0xb8) = lVar19 + local_38;
          *(size_t *)(pbVar6 + 200) = *(long *)(pbVar6 + 200) + local_38;
          *(size_t *)(pbVar6 + 0xa8) = *(long *)(pbVar6 + 0xa8) - local_38;
          *(size_t *)(pbVar6 + 0xa0) = local_38;
          uVar17 = cm_zlib_z_crc32(*(unsigned_long *)(pbVar6 + 0xf0),puVar16,(uInt)local_38);
          *(uLong *)(pbVar6 + 0xf0) = uVar17;
          return 0;
        }
        pcVar20 = "Truncated RAR file data";
      }
    }
    else {
      pcVar20 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar20);
    iVar11 = -0x1e;
  }
  else {
    *size = 0;
    lVar19 = *(long *)((long)pvVar1 + 0xb8);
    *offset = lVar19;
    lVar22 = *(long *)((long)pvVar1 + 0x28);
    if (*(long *)((long)pvVar1 + 0x28) < lVar19) {
      lVar22 = lVar19;
    }
    *offset = lVar22;
LAB_0014eb71:
    iVar11 = 1;
  }
  return iVar11;
switchD_0014e6cb_caseD_0:
  *(undefined1 *)((long)pvVar2 + 0x388) = 1;
  if (local_68 == 0x401) {
LAB_0014eebb:
    Ppmd7_Free((CPpmd7 *)((long)pvVar1 + 0x3d8));
    *(undefined1 *)((long)pvVar1 + 0x388) = 1;
    *(undefined1 *)((long)pvVar1 + 0x3d0) = 0;
    return local_a4;
  }
  goto LAB_0014e44e;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  *buff = NULL;
  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset, 0);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN) {
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
      rar->start_new_table = 1;
      rar->ppmd_valid = 0;
    }
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}